

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

char * mg_get_builtin_mime_type(char *path)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  __int32_t **pp_Var4;
  long lVar5;
  anon_struct_24_3_312ce1a4 *paVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  
  sVar3 = strlen(path);
  pcVar8 = ".bin";
  lVar7 = 0;
  paVar6 = builtin_mime_types;
  do {
    lVar9 = sVar3 - paVar6->ext_len;
    if (paVar6->ext_len <= sVar3 && lVar9 != 0) {
      pp_Var4 = __ctype_tolower_loc();
      lVar5 = 0;
      do {
        iVar1 = (*pp_Var4)[(byte)path[lVar5 + lVar9]];
        iVar2 = (*pp_Var4)[(byte)pcVar8[lVar5]];
        if (path[lVar5 + lVar9] == 0) break;
        lVar5 = lVar5 + 1;
      } while (iVar1 == iVar2);
      if (iVar1 == iVar2) {
        return paVar6->mime_type;
      }
    }
    lVar7 = lVar7 + 1;
    paVar6 = builtin_mime_types + lVar7;
    pcVar8 = paVar6->extension;
    if (lVar7 == 0x51) {
      return "text/plain";
    }
  } while( true );
}

Assistant:

CIVETWEB_API const char *
mg_get_builtin_mime_type(const char *path)
{
	const char *ext;
	size_t i, path_len;

	path_len = strlen(path);

	for (i = 0; builtin_mime_types[i].extension != NULL; i++) {
		ext = path + (path_len - builtin_mime_types[i].ext_len);
		if ((path_len > builtin_mime_types[i].ext_len)
		    && (mg_strcasecmp(ext, builtin_mime_types[i].extension) == 0)) {
			return builtin_mime_types[i].mime_type;
		}
	}

	return "text/plain";
}